

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void proof_chain_start(sat_solver2 *s,clause *c)

{
  Prf_Man_t *p;
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  veci *v;
  uint uVar5;
  
  if (s->fProofLogging != 0) {
    if (s->pInt2 != (Int2_Man_t *)0x0) {
      iVar2 = Int2_ManChainStart(s->pInt2,c);
      s->tempInter = iVar2;
    }
    p = s->pPrf2;
    if (p != (Prf_Man_t *)0x0) {
      if (p->iFirst < 0) {
        __assert_fail("p->iFirst >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0x103,"void Prf_ManChainStart(Prf_Man_t *, clause *)");
      }
      for (iVar2 = 0; iVar2 < p->nWords; iVar2 = iVar2 + 1) {
        pVVar1 = p->vInfo;
        iVar3 = pVVar1->nSize;
        if (iVar3 == pVVar1->nCap) {
          uVar5 = iVar3 * 2;
          if (iVar3 < 0x10) {
            uVar5 = 0x10;
          }
          if (iVar3 < (int)uVar5) {
            if (pVVar1->pArray == (word *)0x0) {
              pwVar4 = (word *)malloc((ulong)uVar5 << 3);
            }
            else {
              pwVar4 = (word *)realloc(pVVar1->pArray,(ulong)uVar5 << 3);
            }
            pVVar1->pArray = pwVar4;
            if (pwVar4 == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar1->nCap = uVar5;
            iVar3 = pVVar1->nSize;
          }
        }
        pVVar1->nSize = iVar3 + 1;
        pVVar1->pArray[iVar3] = 0;
      }
      if (p->pInfo != (word *)0x0) {
        __assert_fail("p->pInfo == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0x107,"void Prf_ManChainStart(Prf_Man_t *, clause *)");
      }
      pwVar4 = Prf_ManClauseInfo(p,p->vInfo->nSize / p->nWords + -1);
      p->pInfo = pwVar4;
      Prf_ManChainResolve(p,c);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      iVar2 = clause2_proofid(s,c,0);
      if (3 < iVar2) {
        v = &s->temp_proof;
        veci_resize(v,0);
        veci_push(v,0);
        veci_push(v,0);
        veci_push(v,iVar2);
        return;
      }
      __assert_fail("(ProofId >> 2) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0xb3,"void proof_chain_start(sat_solver2 *, clause *)");
    }
  }
  return;
}

Assistant:

static inline void proof_chain_start( sat_solver2* s, clause* c )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
        s->tempInter = Int2_ManChainStart( s->pInt2, c );
    if ( s->pPrf2 )
        Prf_ManChainStart( s->pPrf2, c );
    if ( s->pPrf1 )
    {
        int ProofId = clause2_proofid(s, c, 0);
        assert( (ProofId >> 2) > 0 );
        veci_resize( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}